

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::Parser::LocationRecorder::AddPath
          (LocationRecorder *this,int path_component)

{
  int path_component_local;
  LocationRecorder *this_local;
  
  SourceCodeInfo_Location::add_path(this->location_,path_component);
  return;
}

Assistant:

void Parser::LocationRecorder::AddPath(int path_component) {
  location_->add_path(path_component);
}